

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinfo.cxx
# Opt level: O0

void __thiscall
vigra::ImageImportInfo::ImageImportInfo(ImageImportInfo *this,char *filename,uint imageIndex)

{
  undefined4 in_EDX;
  char *in_RSI;
  ArrayVector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ImageImportInfo *in_stack_00000080;
  ArrayVector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  allocator local_15;
  undefined4 local_14;
  
  this_00 = in_RDI;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,in_RSI,&local_15);
  std::allocator<char>::~allocator((allocator<char> *)&local_15);
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *(undefined4 *)((long)&in_RDI[3].capacity_ + 4) = local_14;
  Diff2D::Diff2D((Diff2D *)(in_RDI + 4));
  Size2D::Size2D((Size2D *)0x16ca38);
  ArrayVector<unsigned_char,_std::allocator<unsigned_char>_>::ArrayVector(this_00);
  readHeader_(in_stack_00000080);
  return;
}

Assistant:

ImageImportInfo::ImageImportInfo( const char * filename, unsigned int imageIndex )
    : m_filename(filename), m_image_index(imageIndex)
{
    readHeader_();
}